

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_space_end(nk_context *ctx)

{
  void *ptr;
  nk_size size;
  long in_RDI;
  nk_panel *layout;
  nk_window *win;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) {
    ptr = *(void **)(in_RDI + 0x40d8);
    size = *(nk_size *)((long)ptr + 0xa8);
    *(undefined4 *)(size + 0x90) = 0;
    *(undefined4 *)(size + 0x94) = 0;
    *(undefined4 *)(size + 0x98) = 0;
    nk_zero(ptr,size);
  }
  return;
}

Assistant:

NK_API void
nk_layout_space_end(struct nk_context *ctx)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
layout->row.item_width = 0;
layout->row.item_height = 0;
layout->row.item_offset = 0;
nk_zero(&layout->row.item, sizeof(layout->row.item));
}